

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O1

void xm_volume_slide(xm_channel_context_t *ch,uint8_t rawval)

{
  undefined7 in_register_00000031;
  float fVar1;
  
  if (rawval < 0x10 || (rawval & 0xf) == 0) {
    if (rawval < 0x10) {
      fVar1 = (float)rawval * -0.015625 + ch->volume;
      ch->volume = fVar1;
      if (fVar1 < 0.0) {
        ch->volume = 0.0;
      }
    }
    else {
      fVar1 = (float)((uint)(CONCAT71(in_register_00000031,rawval) >> 4) & 0xfffffff) * 0.015625 +
              ch->volume;
      ch->volume = fVar1;
      if (1.0 < fVar1) {
        ch->volume = 1.0;
        return;
      }
    }
  }
  return;
}

Assistant:

static void xm_volume_slide(xm_channel_context_t* ch, uint8_t rawval) {
	float f;

	if((rawval & 0xF0) && (rawval & 0x0F)) {
		/* Illegal state */
		return;
	}

	if(rawval & 0xF0) {
		/* Slide up */
		f = (float)(rawval >> 4) / (float)0x40;
		ch->volume += f;
		XM_CLAMP_UP(ch->volume);
	} else {
		/* Slide down */
		f = (float)(rawval & 0x0F) / (float)0x40;
		ch->volume -= f;
		XM_CLAMP_DOWN(ch->volume);
	}
}